

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

void json_object_deinit(JSON_Object *object,parson_bool_t free_keys,parson_bool_t free_values)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint i;
  uint local_14;
  
  for (local_14 = 0; (ulong)local_14 < *(ulong *)(in_RDI + 0x30); local_14 = local_14 + 1) {
    if (in_ESI != 0) {
      (*parson_free)(*(void **)(*(long *)(in_RDI + 0x18) + (ulong)local_14 * 8));
    }
    if (in_EDX != 0) {
      json_value_free((JSON_Value *)CONCAT44(in_ESI,in_EDX));
    }
  }
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  (*parson_free)(*(void **)(in_RDI + 8));
  (*parson_free)(*(void **)(in_RDI + 0x18));
  (*parson_free)(*(void **)(in_RDI + 0x20));
  (*parson_free)(*(void **)(in_RDI + 0x28));
  (*parson_free)(*(void **)(in_RDI + 0x10));
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  return;
}

Assistant:

static void json_object_deinit(JSON_Object *object, parson_bool_t free_keys, parson_bool_t free_values) {
    unsigned int i = 0;
    for (i = 0; i < object->count; i++) {
        if (free_keys) {
            parson_free(object->names[i]);
        }
        if (free_values) {
            json_value_free(object->values[i]);
        }
    }

    object->count = 0;
    object->item_capacity = 0;
    object->cell_capacity = 0;

    parson_free(object->cells);
    parson_free(object->names);
    parson_free(object->values);
    parson_free(object->cell_ixs);
    parson_free(object->hashes);

    object->cells = NULL;
    object->names = NULL;
    object->values = NULL;
    object->cell_ixs = NULL;
    object->hashes = NULL;
}